

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Detail::describe_multi_matcher
          (string *__return_storage_ptr__,Detail *this,StringRef combine,string *descriptions_begin,
          string *descriptions_end)

{
  bool bVar1;
  size_type sVar2;
  StringRef rhs;
  string *local_60;
  string *desc_1;
  bool first;
  string *local_48;
  string *desc;
  size_t combined_size;
  string *descriptions_end_local;
  string *descriptions_begin_local;
  StringRef combine_local;
  string *description;
  
  combine_local.m_start = combine.m_start;
  descriptions_begin_local = (string *)this;
  combine_local.m_size = (size_type)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_60 = (string *)combine.m_size;
  for (local_48 = local_60; local_48 != descriptions_begin; local_48 = local_48 + 1) {
    std::__cxx11::string::size();
  }
  sVar2 = StringRef::size((StringRef *)&descriptions_begin_local);
  sVar2 = (((long)descriptions_begin - (long)local_60 >> 5) + -1) * sVar2;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"( ");
  bVar1 = true;
  for (; local_60 != descriptions_begin; local_60 = local_60 + 1) {
    if (bVar1) {
      bVar1 = false;
    }
    else {
      rhs.m_size = sVar2;
      rhs.m_start = combine_local.m_start;
      Catch::operator+=((Catch *)__return_storage_ptr__,descriptions_begin_local,rhs);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_60);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," )");
  return __return_storage_ptr__;
}

Assistant:

std::string describe_multi_matcher(StringRef combine, std::string const* descriptions_begin, std::string const* descriptions_end) {
            std::string description;
            std::size_t combined_size = 4;
            for ( auto desc = descriptions_begin; desc != descriptions_end; ++desc ) {
                combined_size += desc->size();
            }
            combined_size += static_cast<size_t>(descriptions_end - descriptions_begin - 1) * combine.size();

            description.reserve(combined_size);

            description += "( ";
            bool first = true;
            for( auto desc = descriptions_begin; desc != descriptions_end; ++desc ) {
                if( first )
                    first = false;
                else
                    description += combine;
                description += *desc;
            }
            description += " )";
            return description;
        }